

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

ParseLocationRange __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetLocationRange
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  pointer pPVar1;
  bool bVar2;
  int iVar3;
  pointer prVar4;
  ParseLocation PVar5;
  ParseLocation PVar6;
  long lVar7;
  ParseLocationRange PVar8;
  const_iterator it;
  iterator local_40;
  FieldDescriptor *local_30;
  iterator local_28;
  
  local_30 = field;
  CheckFieldIndex(field,index);
  local_40 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>
             ::find<google::protobuf::FieldDescriptor_const*>
                       ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>
                         *)this,&local_30);
  local_28.ctrl_ = (ctrl_t *)0x0;
  bVar2 = absl::lts_20240722::container_internal::operator==(&local_40,&local_28);
  if (bVar2) {
    PVar5.line = -1;
    PVar5.column = -1;
    PVar6.line = -1;
    PVar6.column = -1;
  }
  else {
    iVar3 = 0;
    if (index != -1) {
      iVar3 = index;
    }
    lVar7 = (long)iVar3;
    prVar4 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
             ::iterator::operator->(&local_40);
    PVar5.line = -1;
    PVar5.column = -1;
    PVar6.line = -1;
    PVar6.column = -1;
    if (lVar7 < (long)(prVar4->second).
                      super__Vector_base<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(prVar4->second).
                      super__Vector_base<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) {
      prVar4 = absl::lts_20240722::container_internal::
               raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
               ::iterator::operator->(&local_40);
      pPVar1 = (prVar4->second).
               super__Vector_base<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
               ._M_impl.super__Vector_impl_data._M_start;
      PVar5 = pPVar1[lVar7].start;
      PVar6 = pPVar1[lVar7].end;
    }
  }
  PVar8.end = PVar6;
  PVar8.start = PVar5;
  return PVar8;
}

Assistant:

TextFormat::ParseLocationRange TextFormat::ParseInfoTree::GetLocationRange(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) {
    index = 0;
  }

  auto it = locations_.find(field);
  if (it == locations_.end() ||
      index >= static_cast<int64_t>(it->second.size())) {
    return TextFormat::ParseLocationRange();
  }

  return it->second[static_cast<size_t>(index)];
}